

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_oct(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  error_flags eVar6;
  char *s_;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  basic_substring<const_char> bVar10;
  basic_substring<const_char> local_30;
  
  s_ = this->str;
  uVar9 = this->len;
  bVar5 = false;
  for (; pos < uVar9; pos = pos + 1) {
    bVar1 = s_[pos];
    if ((bVar1 & 0xf8) != 0x30) {
      if (bVar1 == 0x2e) {
        bVar4 = false;
        goto LAB_00193a3f;
      }
      if ((bVar1 & 0xdf) == 0x50) {
        bVar3 = false;
        goto LAB_00193ac0;
      }
      if ((((0x3b < bVar1) || ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
          ((bVar1 != 0x5d && (bVar1 != 0x7d)))) || (!bVar5)) goto LAB_00193bbe;
      basic_substring(&local_30,s_,pos);
      s_ = local_30.str;
      uVar9 = local_30.len;
      goto LAB_00193bc0;
    }
    bVar5 = true;
  }
  uVar8 = 0;
LAB_00193a28:
  if (!bVar5) {
    uVar9 = uVar8;
  }
  goto LAB_00193bc0;
  while( true ) {
    bVar1 = s_[pos];
    bVar4 = true;
    if ((bVar1 & 0xf8) != 0x30) break;
LAB_00193a3f:
    bVar3 = bVar4;
    pos = pos + 1;
    if (uVar9 <= pos) {
      uVar8 = 0;
      if (bVar3) {
        uVar8 = uVar9;
      }
      goto LAB_00193a28;
    }
  }
  if ((bVar1 & 0xdf) == 0x50) {
LAB_00193ac0:
    if ((s_[pos] & 0xdfU) != 0x50) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        bVar10 = (basic_substring<const_char>)(*pcVar2)();
        return bVar10;
      }
      handle_error(0x1e6196,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1a0f,"str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
    }
    uVar8 = pos + 2;
    if (((uVar8 < uVar9) && ((s_[pos + 1] == '+' || (s_[pos + 1] == '-')))) && (bVar5 || bVar3)) {
      bVar5 = false;
      for (; uVar8 < uVar9; uVar8 = uVar8 + 1) {
        bVar1 = s_[uVar8];
        if (9 < (byte)(bVar1 - 0x30)) {
          if ((!bVar5) ||
             ((((0x3b < bVar1 || ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
               (bVar1 != 0x5d)) && (bVar1 != 0x7d)))) goto LAB_00193bbe;
          basic_substring(&local_30,s_,uVar8);
          s_ = local_30.str;
          uVar9 = local_30.len;
          break;
        }
        bVar5 = true;
      }
      goto LAB_00193bc0;
    }
  }
  else {
    uVar7 = (uint)bVar1;
    if (((((uVar7 < 0x3c) && ((0x800120100002601U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) ||
         (uVar7 == 0x5d)) || (uVar7 == 0x7d)) && ((bool)(bVar5 | bVar3))) {
      basic_substring(&local_30,s_,pos);
      s_ = local_30.str;
      uVar9 = local_30.len;
      goto LAB_00193bc0;
    }
  }
LAB_00193bbe:
  uVar9 = 0;
LAB_00193bc0:
  bVar10.len = uVar9;
  bVar10.str = s_;
  return bVar10;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_oct(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '7')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_oct;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_oct;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_oct:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '7')
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_oct;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_oct:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }